

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int __thiscall glslang::TProgram::link(TProgram *this,char *__from,char *__to)

{
  bool bVar1;
  ulong extraout_RAX;
  ulong uVar2;
  EShLanguage local_24;
  char local_1d;
  int s;
  bool error;
  EShMessages messages_local;
  TProgram *this_local;
  undefined7 extraout_var;
  
  if ((this->linked & 1U) == 0) {
    this->linked = true;
    local_1d = '\0';
    SetThreadPoolAllocator(this->pool);
    local_24 = EShLangVertex;
    uVar2 = extraout_RAX;
    while ((int)local_24 < 0xe) {
      bVar1 = linkStage(this,local_24,(EShMessages)__from);
      if (!bVar1) {
        local_1d = '\x01';
      }
      local_24 = local_24 + EShLangTessControl;
      uVar2 = (ulong)local_24;
    }
    if (local_1d == '\0') {
      bVar1 = crossStageCheck(this,(EShMessages)__from);
      uVar2 = CONCAT71(extraout_var,bVar1);
      if (!bVar1) {
        local_1d = '\x01';
      }
    }
    this = (TProgram *)((CONCAT71((int7)(uVar2 >> 8),local_1d) ^ 0xff) & 0xffffffffffffff01);
    this_local._7_1_ = SUB81(this,0);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool TProgram::link(EShMessages messages)
{
    if (linked)
        return false;
    linked = true;

    bool error = false;

    SetThreadPoolAllocator(pool);

    for (int s = 0; s < EShLangCount; ++s) {
        if (! linkStage((EShLanguage)s, messages))
            error = true;
    }

    if (!error) {
        if (! crossStageCheck(messages))
            error = true;
    }

    return ! error;
}